

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CMU462::Collada::ColladaWriter::writeHeader(ofstream *out)

{
  char cVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"<?xml version=\"1.0\" encoding=\"utf-8\"?>",0x26);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,
             "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">",
             0x4e);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<asset>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   <contributor>",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"      <author>Scotty</author>",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,
             "      <authoring_tool>CMU Scotty3D (version 15-462/662)</authoring_tool>",0x48);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   </contributor>",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   <created>",0xc);
  writeCurrentTime(out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"</created>",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   <modified>",0xd);
  writeCurrentTime(out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"</modified>",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"   <unit name=\"meter\" meter=\"1\"/>",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"   <up_axis>Y_UP</up_axis>",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"</asset>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ColladaWriter::writeHeader( ofstream& out )
{

   out << "<?xml version=\"1.0\" encoding=\"utf-8\"?>" << endl;
   out << "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">" << endl;
   out << "<asset>" << endl;
   out << "   <contributor>" << endl;
   out << "      <author>Scotty</author>" << endl;
   out << "      <authoring_tool>CMU Scotty3D (version 15-462/662)</authoring_tool>" << endl;
   out << "   </contributor>" << endl;
   out << "   <created>";
   writeCurrentTime( out );
   out << "</created>" << endl;
   out << "   <modified>";
   writeCurrentTime( out );
   out << "</modified>" << endl;
   out << "   <unit name=\"meter\" meter=\"1\"/>" << endl;
   out << "   <up_axis>Y_UP</up_axis>" << endl;
   out << "</asset>" << endl;
}